

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

void jieba_add_user_words(jieba_t *handle,char **words,size_t count)

{
  char *pcVar1;
  ulong in_RDX;
  long in_RSI;
  Jieba *in_RDI;
  size_t i;
  Jieba *x;
  allocator *word;
  Jieba *this;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  ulong local_28;
  Jieba *local_20;
  ulong local_18;
  long local_10;
  
  local_20 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_28 = 0; local_28 < local_18; local_28 = local_28 + 1) {
    pcVar1 = *(char **)(local_10 + local_28 * 8);
    this = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    word = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"",word);
    cppjieba::Jieba::InsertUserWord(this,(string *)word,(string *)0x14f275);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return;
}

Assistant:

void jieba_add_user_words(jieba_t* handle, const char** words, size_t count) {
  cppjieba::Jieba* x = (cppjieba::Jieba*)handle;
  for (size_t i = 0; i < count; i++) {
    x->InsertUserWord(words[i]);
  }
}